

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defines.cpp
# Opt level: O2

void __thiscall vera::HaveDefines::addDefine(HaveDefines *this,string *_define,vec4 _v)

{
  int in_R8D;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  vec4 _v_local;
  
  _v_local = _v;
  toString_abi_cxx11_(&local_48,(vera *)&_v_local,(vec4 *)0x2c,'\x03',in_R8D);
  std::operator+(&bStack_88,"vec4(",&local_48);
  std::operator+(&local_68,&bStack_88,")");
  (*this->_vptr_HaveDefines[10])(this,_define,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&bStack_88);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void HaveDefines::addDefine( const std::string &_define, glm::vec4 _v ) {
    addDefine(_define, "vec4(" + toString(_v, ',') + ")");
}